

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ShadowName(char *zName)

{
  int iVar1;
  uint local_1c;
  uint i;
  char *zName_local;
  
  local_1c = 0;
  while( true ) {
    if (4 < local_1c) {
      return 0;
    }
    iVar1 = sqlite3_stricmp(zName,fts3ShadowName::azName[local_1c]);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return 1;
}

Assistant:

static int fts3ShadowName(const char *zName){
  static const char *azName[] = {
    "content", "docsize", "segdir", "segments", "stat", 
  };
  unsigned int i;
  for(i=0; i<sizeof(azName)/sizeof(azName[0]); i++){
    if( sqlite3_stricmp(zName, azName[i])==0 ) return 1;
  }
  return 0;
}